

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<unsigned_char,_3U>::resample
          (ImageT<unsigned_char,_3U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  Color *pCVar1;
  format_args args;
  string_view fmt;
  byte bVar2;
  uint uVar3;
  pointer pIVar4;
  uint *puVar5;
  runtime_error *this_00;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *pfVar6;
  pointer pRVar7;
  byte *pbVar8;
  reference pvVar9;
  reference pvVar10;
  value_type pfVar11;
  reference ppfVar12;
  uchar *puVar13;
  int in_ECX;
  int iVar14;
  uint in_EDX;
  size_t extraout_RDX;
  unsigned_long_long in_RSI;
  v10 *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_RDI;
  float fVar15;
  value_type vVar16;
  uchar unormValue;
  float outValue;
  float linearValue;
  uint32_t c_3;
  Color *targetPixel;
  uint32_t targetX;
  uint32_t c_2;
  array<const_float_*,_3UL> outputLine;
  uint32_t c_1;
  float value;
  uint32_t c;
  Color *sourcePixel;
  uint32_t sourceX;
  uint32_t sourceY;
  uint32_t targetY;
  TransferFunction *tf;
  TransferFunctionLinear tfLinear;
  TransferFunctionSRGB tfSRGB;
  uint32_t i;
  bool isHDR;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL> resamplers
  ;
  array<std::vector<float,_std::allocator<float>_>,_3UL> samples;
  uint32_t sourceHeight;
  uint32_t sourceWidth;
  __single_object target;
  unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *in_stack_fffffffffffffcb8;
  array<std::vector<float,_std::allocator<float>_>,_3UL> *in_stack_fffffffffffffcc0;
  unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>
  *in_stack_fffffffffffffcc8;
  array<std::vector<float,_std::allocator<float>_>,_3UL> *in_stack_fffffffffffffcd0;
  Contrib_List **__new_size;
  uint *in_stack_fffffffffffffce0;
  vector<float,_std::allocator<float>_> *this_02;
  uint *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined1 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd09;
  undefined1 in_stack_fffffffffffffd0a;
  uchar uVar17;
  undefined1 in_stack_fffffffffffffd0b;
  undefined4 in_stack_fffffffffffffd0c;
  uint *in_stack_fffffffffffffd10;
  long *plVar18;
  float *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  char **in_stack_fffffffffffffd40;
  long *pFilter;
  Resampler *in_stack_fffffffffffffd48;
  Contrib_List **in_stack_fffffffffffffd50;
  Contrib_List *__args_12;
  float *in_stack_fffffffffffffd70;
  bool local_24e;
  uint local_244;
  uint local_238;
  uint local_234;
  undefined1 local_230 [28];
  uint local_214;
  float local_210;
  uint local_20c;
  color<unsigned_char,_3U> *local_208;
  uint local_1fc;
  uint local_1f8;
  int local_1f4;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  uint local_1d8;
  Boundary_Op local_1d4;
  Contrib_List *local_1d0;
  undefined1 local_1c8 [12];
  undefined8 local_1bc;
  uint local_1b0;
  undefined1 local_1a9;
  Contrib_List *local_1a8 [12];
  undefined1 local_141;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_140;
  char *local_130 [2];
  string local_120 [32];
  uint local_100;
  uint local_fc [5];
  unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_> local_e8;
  int local_e0;
  uint local_dc;
  unsigned_long_long uVar19;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar20;
  undefined8 local_b0;
  undefined1 *local_a8;
  char *local_a0;
  size_t local_98;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_90;
  char *local_88;
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char **local_58;
  char **local_50;
  char *local_48;
  size_t sStack_40;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  char *local_8;
  
  local_e0 = in_ECX;
  local_dc = in_EDX;
  uVar19 = in_RSI;
  aVar20 = in_RDI;
  std::make_unique<ImageT<unsigned_char,3u>,unsigned_int&,unsigned_int&>
            (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  pIVar4 = std::
           unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>::
           operator->((unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>
                       *)0x294feb);
  Image::setTransferFunction(&pIVar4->super_Image,*(khr_df_transfer_e *)(in_RSI + 0x10));
  pIVar4 = std::
           unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>::
           operator->((unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>
                       *)0x29500b);
  Image::setPrimaries(&pIVar4->super_Image,*(khr_df_primaries_e *)(in_RSI + 0x14));
  local_fc[0] = *(uint *)(in_RSI + 8);
  local_100 = *(uint *)(in_RSI + 0xc);
  local_24e = false;
  if (((local_fc[0] != 0) && (local_24e = false, local_100 != 0)) &&
     (local_24e = false, local_dc != 0)) {
    local_24e = local_e0 != 0;
  }
  if (local_24e) {
    this_01 = (v10 *)&local_100;
    puVar5 = std::max<unsigned_int>(local_fc,(uint *)this_01);
    if (*puVar5 < 0x4001) {
      this_01 = (v10 *)&local_e0;
      puVar5 = std::max<unsigned_int>(&local_dc,(uint *)this_01);
      if (*puVar5 < 0x4001) {
        std::array<std::vector<float,_std::allocator<float>_>,_3UL>::array
                  (in_stack_fffffffffffffcd0);
        std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
        ::array((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
                 *)in_stack_fffffffffffffcd0);
        local_1a9 = 0;
        for (local_1b0 = 0; local_1b0 < 3; local_1b0 = local_1b0 + 1) {
          local_1bc._0_4_ = 0;
          local_1c8._8_4_ = 0x3f800000;
          if (local_1b0 == 0) {
            __args_12 = (Contrib_List *)0x0;
          }
          else {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
                          *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
            pRVar7 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                     operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                 *)0x295437);
            __args_12 = basisu::Resampler::get_clist_x(pRVar7);
          }
          local_1c8._0_8_ = __args_12;
          if (local_1b0 == 0) {
            local_1d0 = (Contrib_List *)0x0;
          }
          else {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
                          *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
            pRVar7 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                     operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                 *)0x295486);
            local_1d0 = basisu::Resampler::get_clist_y(pRVar7);
          }
          local_1d4 = BOUNDARY_WRAP;
          local_1d8 = 0;
          this_02 = (vector<float,_std::allocator<float>_> *)(local_fc + 4);
          __new_size = &local_1d0;
          in_stack_fffffffffffffcd0 =
               (array<std::vector<float,_std::allocator<float>_>,_3UL> *)local_1c8;
          in_stack_fffffffffffffcc8 = &local_e8;
          in_stack_fffffffffffffcc0 =
               (array<std::vector<float,_std::allocator<float>_>,_3UL> *)(local_1c8 + 8);
          in_stack_fffffffffffffcb8 =
               (unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)&local_1bc;
          std::
          make_unique<basisu::Resampler,unsigned_int_const&,unsigned_int_const&,unsigned_int&,unsigned_int&,basisu::Resampler::Boundary_Op&,float,float,char_const*&,basisu::Resampler::Contrib_List*,basisu::Resampler::Contrib_List*,float&,float&,float,float>
                    (in_stack_fffffffffffffd10,
                     (uint *)CONCAT44(in_stack_fffffffffffffd0c,
                                      CONCAT13(in_stack_fffffffffffffd0b,
                                               CONCAT12(in_stack_fffffffffffffd0a,
                                                        CONCAT11(in_stack_fffffffffffffd09,
                                                                 in_stack_fffffffffffffd08)))),
                     (uint *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                     &local_1d8,&local_1d4,in_stack_fffffffffffffd30,
                     (float *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                     in_stack_fffffffffffffd40,(Contrib_List **)in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd50,(float *)&stack0xfffffffffffffcb8,(float *)local_1d0,
                     (float *)__args_12,in_stack_fffffffffffffd70);
          in_stack_fffffffffffffd50 = local_1a8;
          std::
          array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>::
          operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
                      *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
          in_stack_fffffffffffffd48 = (Resampler *)((long)&local_1bc + 4);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator=
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     in_stack_fffffffffffffcc0);
          std::
          array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>::
          operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
                      *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator*
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     in_stack_fffffffffffffcc0);
          checkResamplerStatus(in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
          std::array<std::vector<float,_std::allocator<float>_>,_3UL>::operator[]
                    (in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
          std::vector<float,_std::allocator<float>_>::resize(this_02,(size_type)__new_size);
        }
        TransferFunctionSRGB::TransferFunctionSRGB
                  ((TransferFunctionSRGB *)in_stack_fffffffffffffcc0);
        TransferFunctionLinear::TransferFunctionLinear
                  ((TransferFunctionLinear *)in_stack_fffffffffffffcc0);
        if (*(int *)(in_RSI + 0x10) == 2) {
          pFilter = &local_1e0;
        }
        else {
          pFilter = &local_1e8;
        }
        local_1f4 = 0;
        local_1f0 = pFilter;
        for (local_1f8 = 0; local_1f8 < local_100; local_1f8 = local_1f8 + 1) {
          for (local_1fc = 0; local_1fc < local_fc[0]; local_1fc = local_1fc + 1) {
            local_208 = (color<unsigned_char,_3U> *)
                        (*(long *)(in_RSI + 0x18) + (ulong)(local_1f8 * local_fc[0] + local_1fc) * 3
                        );
            for (local_20c = 0; local_20c < 3; local_20c = local_20c + 1) {
              pbVar8 = color<unsigned_char,_3U>::operator[](local_208,local_20c);
              fVar15 = (float)*pbVar8;
              bVar2 = color_base<unsigned_char,_3U>::one();
              local_210 = fVar15 * (1.0 / (float)bVar2);
              plVar18 = local_1f0;
              if (local_20c == 3) {
                plVar18 = &local_1e8;
              }
              vVar16 = (value_type)(**(code **)(*plVar18 + 8))(local_210);
              pvVar9 = std::array<std::vector<float,_std::allocator<float>_>,_3UL>::operator[]
                                 (in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
              pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                  (pvVar9,(ulong)local_1fc);
              *pvVar10 = vVar16;
            }
          }
          for (local_214 = 0; local_214 < 3; local_214 = local_214 + 1) {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
                          *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
            pRVar7 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                     operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                 *)0x29587f);
            pvVar9 = std::array<std::vector<float,_std::allocator<float>_>,_3UL>::operator[]
                               (in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
            std::vector<float,_std::allocator<float>_>::operator[](pvVar9,0);
            bVar2 = basisu::Resampler::put_line((float *)pRVar7);
            if ((bVar2 & 1) == 0) {
              std::
              array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
              ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
                            *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
              std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator*
                        ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                         in_stack_fffffffffffffcc0);
              checkResamplerStatus(in_stack_fffffffffffffd48,(char *)pFilter);
            }
          }
          while( true ) {
            memset(local_230,0,0x18);
            for (local_234 = 0; local_234 < 3; local_234 = local_234 + 1) {
              std::
              array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
              ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
                            *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
              std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
              operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                         0x295958);
              pfVar11 = (value_type)basisu::Resampler::get_line();
              ppfVar12 = std::array<const_float_*,_3UL>::operator[]
                                   ((array<const_float_*,_3UL> *)in_stack_fffffffffffffcc0,
                                    (size_type)in_stack_fffffffffffffcb8);
              *ppfVar12 = pfVar11;
            }
            ppfVar12 = std::array<const_float_*,_3UL>::operator[]
                                 ((array<const_float_*,_3UL> *)in_stack_fffffffffffffcc0,
                                  (size_type)in_stack_fffffffffffffcb8);
            if (*ppfVar12 == (value_type)0x0) break;
            for (local_238 = 0; local_238 < local_dc; local_238 = local_238 + 1) {
              pIVar4 = std::
                       unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>
                       ::operator->((unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>
                                     *)0x2959e0);
              pCVar1 = pIVar4->pixels;
              iVar14 = local_1f4 * local_dc;
              for (local_244 = 0; local_244 < 3; local_244 = local_244 + 1) {
                ppfVar12 = std::array<const_float_*,_3UL>::operator[]
                                     ((array<const_float_*,_3UL> *)in_stack_fffffffffffffcc0,
                                      (size_type)in_stack_fffffffffffffcb8);
                plVar18 = local_1f0;
                if (local_244 == 3) {
                  plVar18 = &local_1e8;
                }
                fVar15 = (float)(**(code **)*plVar18)((*ppfVar12)[local_238]);
                uVar3 = std::isnan((double)(ulong)(uint)fVar15);
                if ((uVar3 & 1) == 0) {
                  if (0.0 <= fVar15) {
                    if (fVar15 <= 1.0) {
                      bVar2 = color_base<unsigned_char,_3U>::one();
                      uVar17 = (uchar)(int)(fVar15 * (float)bVar2 + 0.5);
                    }
                    else {
                      uVar17 = color_base<unsigned_char,_3U>::one();
                    }
                  }
                  else {
                    uVar17 = '\0';
                  }
                }
                else {
                  uVar17 = '\0';
                }
                puVar13 = color<unsigned_char,_3U>::operator[]
                                    (pCVar1 + (iVar14 + local_238),local_244);
                *puVar13 = uVar17;
              }
            }
            local_1f4 = local_1f4 + 1;
          }
        }
        std::unique_ptr<Image,std::default_delete<Image>>::
        unique_ptr<ImageT<unsigned_char,3u>,std::default_delete<ImageT<unsigned_char,3u>>,void>
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffcd0,
                   in_stack_fffffffffffffcc8);
        TransferFunctionLinear::~TransferFunctionLinear((TransferFunctionLinear *)0x295bee);
        TransferFunctionSRGB::~TransferFunctionSRGB((TransferFunctionSRGB *)0x295bfb);
        std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
        ::~array((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
                  *)in_stack_fffffffffffffcd0);
        std::array<std::vector<float,_std::allocator<float>_>,_3UL>::~array
                  (in_stack_fffffffffffffcd0);
        std::unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>
        ::~unique_ptr((unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>
                       *)in_stack_fffffffffffffcc0);
        return (unique_ptr<Image,_std::default_delete<Image>_>)in_RDI.values_;
      }
    }
    local_141 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68 = local_130;
    local_70 = "Image larger than max supported size of {}";
    local_60 = "Image larger than max supported size of {}";
    local_130[0] = "Image larger than max supported size of {}";
    local_58 = local_68;
    local_98 = std::char_traits<char>::length((char_type *)0x295176);
    local_8 = local_70;
    local_140.int_value = 0x4000;
    local_78 = local_120;
    local_88 = local_130[0];
    local_90 = &local_140;
    local_50 = &local_88;
    local_a0 = local_130[0];
    sStack_80 = local_98;
    local_48 = local_a0;
    sStack_40 = local_98;
    pfVar6 = ::fmt::v10::
             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                       ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int>
                         *)&local_90->string,this_01,(int *)local_78);
    local_30 = &local_b0;
    local_38 = &stack0xffffffffffffff38;
    local_18 = 1;
    local_b0 = 1;
    fmt.size_ = extraout_RDX;
    fmt.data_ = (char *)pfVar6;
    args.field_1.values_ = aVar20.values_;
    args.desc_ = uVar19;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    local_a8 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(fmt,args);
    std::runtime_error::runtime_error(this_00,local_120);
    local_141 = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x461,
                "virtual std::unique_ptr<Image> ImageT<unsigned char, 3>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = unsigned char, componentCount = 3]"
               );
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }